

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::LennardJonesAtomTypesSectionParser::parseLine
          (LennardJonesAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *AT;
  undefined8 uVar2;
  uint in_ECX;
  ForceField *in_RDI;
  StringTokenizer *this_00;
  LennardJonesAdapter lj;
  string pot_type;
  bool isSoft;
  RealType sigma;
  RealType epsilon;
  AtomType *atomType;
  string atomTypeName;
  int nTokens;
  StringTokenizer tokenizer;
  char *in_stack_fffffffffffffe88;
  undefined6 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  StringTokenizer *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffec0;
  errorStruct *peVar3;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined1 in_stack_fffffffffffffeef;
  RealType in_stack_fffffffffffffef0;
  RealType in_stack_fffffffffffffef8;
  LennardJonesAdapter *in_stack_ffffffffffffff00;
  string local_d0 [8];
  StringTokenizer *in_stack_ffffffffffffff38;
  allocator<char> local_99;
  string local_98 [124];
  uint local_1c;
  
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (allocator<char> *)in_stack_fffffffffffffec0);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_RDI,
             (string *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  iVar1 = StringTokenizer::countTokens(in_stack_fffffffffffffea0);
  if (iVar1 < 3) {
    peVar3 = &painCave;
    snprintf(painCave.errMsg,2000,
             "LennardJonesAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    peVar3->isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff38);
    AT = ForceField::getAtomType(in_RDI,(string *)CONCAT44(iVar1,in_stack_fffffffffffffec8));
    if (AT == (AtomType *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      peVar3 = &painCave;
      snprintf(painCave.errMsg,2000,
               "LennardJonesAtomTypesSectionParser Error: Atom Type [%s] is not created yet\n",uVar2
              );
      peVar3->isFatal = 1;
      simError();
    }
    else {
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_RDI);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_RDI);
      ForceFieldOptions::getEnergyUnitScaling((ForceFieldOptions *)0x357a1f);
      this_00 = (StringTokenizer *)
                ForceFieldOptions::getDistanceUnitScaling((ForceFieldOptions *)0x357a51);
      in_stack_fffffffffffffe97 = StringTokenizer::hasMoreTokens(this_00);
      if ((bool)in_stack_fffffffffffffe97) {
        StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff38);
        in_stack_fffffffffffffe96 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffe97,
                                      CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90))
                             ,in_stack_fffffffffffffe88);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
      }
      LennardJonesAdapter::LennardJonesAdapter((LennardJonesAdapter *)&stack0xfffffffffffffee8,AT);
      LennardJonesAdapter::makeLennardJones
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 (bool)in_stack_fffffffffffffeef);
    }
    std::__cxx11::string::~string(local_d0);
  }
  StringTokenizer::~StringTokenizer
            ((StringTokenizer *)
             CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
  return;
}

Assistant:

void LennardJonesAtomTypesSectionParser::parseLine(ForceField& ff,
                                                     const std::string& line,
                                                     int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in LennardJonesAtomTypesSectionParser, a line at least contains 3 tokens
    // atomTypeName, epsilon and sigma
    if (nTokens < 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        RealType epsilon = tokenizer.nextTokenAsDouble();
        RealType sigma   = tokenizer.nextTokenAsDouble();
        bool isSoft      = false;

        epsilon *= options_.getEnergyUnitScaling();
        sigma *= options_.getDistanceUnitScaling();

        if (tokenizer.hasMoreTokens()) {
          std::string pot_type = tokenizer.nextToken();
          if (pot_type == "soft") { isSoft = true; }
        }

        LennardJonesAdapter lj = LennardJonesAdapter(atomType);
        lj.makeLennardJones(sigma, epsilon, isSoft);

      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "LennardJonesAtomTypesSectionParser Error: Atom Type [%s] is not "
            "created yet\n",
            atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }